

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# io.c
# Opt level: O3

int IoCommandReadPla(Abc_Frame_t *pAbc,int argc,char **argv)

{
  int iVar1;
  Abc_Ntk_t *pNtk;
  Abc_Ntk_t *pNtk_00;
  char *pcVar2;
  uint fCheck;
  uint fZeros;
  char *pcVar3;
  uint local_3c;
  uint local_38;
  uint local_34;
  
  fZeros = 0;
  Extra_UtilGetoptReset();
  fCheck = 1;
  local_3c = 0;
  local_38 = 0;
  local_34 = 0;
  while( true ) {
    while( true ) {
      while (iVar1 = Extra_UtilGetopt(argc,argv,"zbdxch"), iVar1 == 99) {
        fCheck = fCheck ^ 1;
      }
      if (iVar1 < 100) break;
      if (iVar1 == 100) {
        local_38 = local_38 ^ 1;
      }
      else if (iVar1 == 0x78) {
        local_34 = local_34 ^ 1;
      }
      else {
        if (iVar1 != 0x7a) goto LAB_00327e10;
        fZeros = fZeros ^ 1;
      }
    }
    if (iVar1 == -1) break;
    if (iVar1 != 0x62) goto LAB_00327e10;
    local_3c = local_3c ^ 1;
  }
  if (globalUtilOptind + 1 == argc) {
    if (((fZeros == 0 && local_3c == 0) && local_38 == 0) && local_34 == 0) {
      pNtk_00 = Io_Read(argv[globalUtilOptind],IO_FILE_PLA,fCheck,0);
    }
    else {
      pNtk = Io_ReadPla(argv[globalUtilOptind],fZeros,local_3c,local_38,local_34,fCheck);
      if (pNtk == (Abc_Ntk_t *)0x0) {
        puts("Reading PLA file has failed.");
        return 1;
      }
      pNtk_00 = Abc_NtkToLogic(pNtk);
      Abc_NtkDelete(pNtk);
    }
    if (pNtk_00 == (Abc_Ntk_t *)0x0) {
      return 1;
    }
    Abc_FrameReplaceCurrentNetwork(pAbc,pNtk_00);
    Abc_FrameClearVerifStatus(pAbc);
    return 0;
  }
LAB_00327e10:
  fwrite("usage: read_pla [-zbdxch] <file>\n",0x21,1,(FILE *)pAbc->Err);
  fwrite("\t         reads the network in PLA\n",0x23,1,(FILE *)pAbc->Err);
  pcVar3 = "off-set";
  pcVar2 = "off-set";
  if (fZeros == 0) {
    pcVar2 = "on-set";
  }
  fprintf((FILE *)pAbc->Err,"\t-z     : toggle reading on-set and off-set [default = %s]\n",pcVar2);
  pcVar2 = "off-set";
  if (local_3c == 0) {
    pcVar2 = "on-set";
  }
  fprintf((FILE *)pAbc->Err,
          "\t-b     : toggle reading both on-set and off-set as on-set [default = %s]\n",pcVar2);
  if (local_38 == 0) {
    pcVar3 = "on-set";
  }
  fprintf((FILE *)pAbc->Err,
          "\t-d     : toggle reading both on-set and dc-set as on-set [default = %s]\n",pcVar3);
  pcVar3 = "yes";
  pcVar2 = "yes";
  if (local_34 == 0) {
    pcVar2 = "no";
  }
  fprintf((FILE *)pAbc->Err,
          "\t-x     : toggle reading Exclusive SOP rather than SOP [default = %s]\n",pcVar2);
  if (fCheck == 0) {
    pcVar3 = "no";
  }
  fprintf((FILE *)pAbc->Err,"\t-c     : toggle network check after reading [default = %s]\n",pcVar3)
  ;
  fwrite("\t-h     : prints the command summary\n",0x25,1,(FILE *)pAbc->Err);
  fwrite("\tfile   : the name of a file to read\n",0x25,1,(FILE *)pAbc->Err);
  return 1;
}

Assistant:

int IoCommandReadPla( Abc_Frame_t * pAbc, int argc, char ** argv )
{
    Abc_Ntk_t * pNtk;
    char * pFileName;
    int c, fZeros = 0, fBoth = 0, fOnDc = 0, fSkipPrepro = 0, fCheck = 1;

    Extra_UtilGetoptReset();
    while ( ( c = Extra_UtilGetopt( argc, argv, "zbdxch" ) ) != EOF )
    {
        switch ( c )
        {
            case 'z':
                fZeros ^= 1;
                break;
            case 'b':
                fBoth ^= 1;
                break;
            case 'd':
                fOnDc ^= 1;
                break;
            case 'x':
                fSkipPrepro ^= 1;
                break;
            case 'c':
                fCheck ^= 1;
                break;
            case 'h':
                goto usage;
            default:
                goto usage;
        }
    }
    if ( argc != globalUtilOptind + 1 )
        goto usage;
    // get the input file name
    pFileName = argv[globalUtilOptind];
    // read the file using the corresponding file reader
    if ( fZeros || fBoth || fOnDc || fSkipPrepro )
    {
        Abc_Ntk_t * pTemp;
        pNtk = Io_ReadPla( pFileName, fZeros, fBoth, fOnDc, fSkipPrepro, fCheck );
        if ( pNtk == NULL )
        {
            printf( "Reading PLA file has failed.\n" );
            return 1;
        }
        pNtk = Abc_NtkToLogic( pTemp = pNtk );
        Abc_NtkDelete( pTemp );
    }
    else
        pNtk = Io_Read( pFileName, IO_FILE_PLA, fCheck, 0 );
    if ( pNtk == NULL )
        return 1;
    // replace the current network
    Abc_FrameReplaceCurrentNetwork( pAbc, pNtk );
    Abc_FrameClearVerifStatus( pAbc );
    return 0;

usage:
    fprintf( pAbc->Err, "usage: read_pla [-zbdxch] <file>\n" );
    fprintf( pAbc->Err, "\t         reads the network in PLA\n" );
    fprintf( pAbc->Err, "\t-z     : toggle reading on-set and off-set [default = %s]\n", fZeros? "off-set":"on-set" );
    fprintf( pAbc->Err, "\t-b     : toggle reading both on-set and off-set as on-set [default = %s]\n", fBoth? "off-set":"on-set" );
    fprintf( pAbc->Err, "\t-d     : toggle reading both on-set and dc-set as on-set [default = %s]\n", fOnDc? "off-set":"on-set" );
    fprintf( pAbc->Err, "\t-x     : toggle reading Exclusive SOP rather than SOP [default = %s]\n", fSkipPrepro? "yes":"no" );
    fprintf( pAbc->Err, "\t-c     : toggle network check after reading [default = %s]\n", fCheck? "yes":"no" );
    fprintf( pAbc->Err, "\t-h     : prints the command summary\n" );
    fprintf( pAbc->Err, "\tfile   : the name of a file to read\n" );
    return 1;
}